

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyHttpImplPrivate::wantUploadDataSlot(QNetworkReplyHttpImplPrivate *this,qint64 maxSize)

{
  element_type *peVar1;
  QNetworkReplyHttpImpl *this_00;
  qint64 _t1;
  bool _t3;
  char *pcVar2;
  qint64 _t4;
  long in_FS_OFFSET;
  qint64 currentUploadDataLength;
  QArrayDataPointer<char> local_58;
  long local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (this->uploadByteDevice).
           super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    this_00 = *(QNetworkReplyHttpImpl **)&(this->super_QNetworkReplyPrivate).field_0x8;
    local_38 = 0;
    pcVar2 = (char *)(**(code **)(*(long *)peVar1 + 0x60))(peVar1,maxSize,&local_38);
    if (local_38 == 0) {
      this->uploadDeviceChoking = true;
    }
    else {
      this->uploadDeviceChoking = false;
      local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)&local_58,pcVar2,local_38);
      _t1 = this->uploadByteDevicePosition;
      _t3 = (bool)(**(code **)(*(long *)(this->uploadByteDevice).
                                        super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x70))();
      _t4 = (**(code **)(*(long *)(this->uploadByteDevice).
                                  super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr + 0x88))();
      QNetworkReplyHttpImpl::haveUploadData(this_00,_t1,(QByteArray *)&local_58,_t3,_t4);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::wantUploadDataSlot(qint64 maxSize)
{
    Q_Q(QNetworkReplyHttpImpl);

    if (!uploadByteDevice) // uploadByteDevice is no longer available
        return;

    // call readPointer
    qint64 currentUploadDataLength = 0;
    char *data = const_cast<char*>(uploadByteDevice->readPointer(maxSize, currentUploadDataLength));

    if (currentUploadDataLength == 0) {
        uploadDeviceChoking = true;
        // No bytes from upload byte device. There will be bytes later, it will emit readyRead()
        // and our uploadByteDeviceReadyReadSlot() is called.
        return;
    } else {
        uploadDeviceChoking = false;
    }

    // Let's make a copy of this data
    QByteArray dataArray(data, currentUploadDataLength);

    // Communicate back to HTTP thread
    emit q->haveUploadData(uploadByteDevicePosition, dataArray, uploadByteDevice->atEnd(), uploadByteDevice->size());
}